

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_color_cycle(parser *p)

{
  monster_race *race;
  char *__s;
  char *__s_00;
  size_t sVar1;
  char *cycle;
  char *group;
  monster_race *r;
  parser *p_local;
  
  race = (monster_race *)parser_priv(p);
  __s = parser_getsym(p,"group");
  __s_00 = parser_getsym(p,"cycle");
  if (race == (monster_race *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if ((__s != (char *)0x0) && (sVar1 = strlen(__s), sVar1 != 0)) {
      if ((__s_00 != (char *)0x0) && (sVar1 = strlen(__s_00), sVar1 != 0)) {
        visuals_cycler_set_cycle_for_race(race,__s,__s_00);
        return PARSE_ERROR_NONE;
      }
      return PARSE_ERROR_INVALID_VALUE;
    }
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_color_cycle(struct parser *p)
{
	struct monster_race *r = parser_priv(p);
	const char *group = parser_getsym(p, "group");
	const char *cycle = parser_getsym(p, "cycle");

	if (r == NULL)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	if (group == NULL || strlen(group) == 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (cycle == NULL || strlen(cycle) == 0)
		return PARSE_ERROR_INVALID_VALUE;

	visuals_cycler_set_cycle_for_race(r, group, cycle);

	return PARSE_ERROR_NONE;
}